

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

uchar * voc_push_list_siz(voccxdef *ctx,uint lstsiz)

{
  runcxdef *ctx_00;
  uint16_t tmp;
  uint siz;
  uchar *puVar1;
  runsdef val;
  runsdef local_28;
  
  ctx_00 = ctx->voccxrun;
  siz = lstsiz + 2;
  if ((uint)(*(int *)&ctx_00->runcxhtop - *(int *)&ctx_00->runcxhp) <= siz) {
    runhcmp(ctx_00,siz,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
  }
  local_28.runstyp = '\a';
  local_28.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->voccxrun->runcxhp;
  *(short *)local_28.runsv.runsvstr = (short)siz;
  puVar1 = (uchar *)(local_28.runsv.runsvnum + 2);
  ctx_00->runcxhp = ctx_00->runcxhp + siz;
  runrepush(ctx_00,&local_28);
  return puVar1;
}

Assistant:

uchar *voc_push_list_siz(voccxdef *ctx, uint lstsiz)
{
    runcxdef *rcx = ctx->voccxrun;
    runsdef val;
    uchar *lstp;

    /* add in the size needed for the list's length prefix */
    lstsiz += 2;

    /* allocate space in the heap */
    runhres(rcx, lstsiz, 0);

    /* set up a stack value to push */
    val.runstyp = DAT_LIST;
    val.runsv.runsvstr = lstp = ctx->voccxrun->runcxhp;

    /* set up the list's length prefix */
    oswp2(lstp, lstsiz);
    lstp += 2;

    /* commit the space in the heap */
    rcx->runcxhp += lstsiz;

    /* push the list value (repush, since we can use the original copy) */
    runrepush(rcx, &val);

    /* return the list element pointer */
    return lstp;
}